

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  undefined7 in_register_00000009;
  byte *pbVar10;
  uint uVar11;
  uint uVar12;
  byte *pbVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  double dVar22;
  
  *pResult = 0.0;
  uVar11 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar11 == 1) {
    lVar18 = 1;
    iVar15 = 1;
    pbVar10 = (byte *)z;
  }
  else {
    uVar9 = (ulong)(3 - uVar11);
    iVar15 = 1;
    if ((int)(3 - uVar11) < length) {
      uVar9 = (ulong)(int)(3 - uVar11);
      do {
        if (z[uVar9] != '\0') {
          iVar15 = -100;
          goto LAB_00169f8a;
        }
        uVar9 = uVar9 + 2;
      } while ((long)uVar9 < (long)length);
      iVar15 = 1;
    }
LAB_00169f8a:
    length = (uint)uVar9 ^ 1;
    pbVar10 = (byte *)(z + (uVar11 & 1));
    lVar18 = 2;
  }
  pbVar13 = (byte *)(z + length);
  while( true ) {
    if (pbVar13 <= pbVar10) {
      return 0;
    }
    bVar1 = *pbVar10;
    if ((""[bVar1] & 1) == 0) break;
    pbVar10 = pbVar10 + lVar18;
  }
  iVar16 = 0;
  lVar14 = 0;
  if ((bVar1 - 0x2b & 0xfd) == 0) {
    lVar14 = lVar18;
  }
  pbVar10 = pbVar10 + lVar14;
  bVar7 = true;
  if (pbVar13 <= pbVar10) {
LAB_0016a182:
    if (bVar1 == 0x2d) {
      dVar22 = -0.0;
    }
    else {
      dVar22 = 0.0;
    }
LAB_0016a279:
    *pResult = dVar22;
    if ((((bVar7) && (pbVar10 == pbVar13)) && (0 < iVar16)) && (0 < iVar15)) {
      return iVar15;
    }
    if (((1 < iVar15) && (bVar7 || iVar15 == 3)) && (0 < iVar16)) {
      return -1;
    }
    return 0;
  }
  iVar16 = 0;
  iVar8 = 0;
  lVar14 = 0;
LAB_0016a004:
  bVar2 = *pbVar10;
  if (0xfffffffffffffff5 < (ulong)bVar2 - 0x3a) goto code_r0x0016a014;
  if (bVar2 == 0x2e) {
    iVar15 = iVar15 + 1;
    while ((pbVar10 = pbVar10 + lVar18, pbVar10 < pbVar13 &&
           (0xfffffffffffffff5 < (ulong)*pbVar10 - 0x3a))) {
      if (lVar14 < 0xccccccccccccccb) {
        lVar14 = (long)(char)*pbVar10 + lVar14 * 10 + -0x30;
        iVar8 = iVar8 + -1;
        iVar16 = iVar16 + 1;
      }
    }
  }
  if (pbVar10 < pbVar13) {
    if ((*pbVar10 | 0x20) == 0x65) {
      pbVar10 = pbVar10 + lVar18;
      iVar15 = iVar15 + 1;
      if (pbVar13 <= pbVar10) {
        iVar21 = 0;
        iVar17 = 1;
        bVar7 = false;
        goto LAB_0016a0ef;
      }
      iVar17 = 1;
      if (*pbVar10 == 0x2b) {
        pbVar10 = pbVar10 + lVar18;
      }
      else if (*pbVar10 == 0x2d) {
        pbVar10 = pbVar10 + lVar18;
        iVar17 = -1;
      }
      iVar21 = 0;
      if (pbVar10 < pbVar13) {
        uVar9 = (ulong)*pbVar10;
        if (uVar9 - 0x3a < 0xfffffffffffffff6) {
          bVar7 = false;
        }
        else {
          iVar20 = 0;
          do {
            pbVar10 = pbVar10 + lVar18;
            iVar21 = (char)uVar9 + -0x30 + iVar20 * 10;
            if (9999 < iVar20) {
              iVar21 = 10000;
            }
            bVar7 = true;
          } while ((pbVar10 < pbVar13) &&
                  (uVar9 = (ulong)*pbVar10, iVar20 = iVar21, 0xfffffffffffffff5 < uVar9 - 0x3a));
        }
      }
      else {
        bVar7 = false;
      }
    }
    else {
      iVar21 = 0;
      iVar17 = 1;
      bVar7 = true;
    }
    while ((pbVar10 < pbVar13 && ((""[*pbVar10] & 1) != 0))) {
      pbVar10 = pbVar10 + lVar18;
    }
  }
  else {
LAB_0016a0e1:
    iVar21 = 0;
    iVar17 = 1;
    bVar7 = true;
  }
LAB_0016a0ef:
  if (lVar14 == 0) goto LAB_0016a182;
  uVar19 = iVar21 * iVar17 + iVar8;
  uVar11 = -uVar19;
  if (0 < (int)uVar19) {
    uVar11 = uVar19;
  }
  uVar12 = uVar11;
  if (uVar19 == 0) {
LAB_0016a1a1:
    lVar18 = -lVar14;
    if (bVar1 != 0x2d) {
      lVar18 = lVar14;
    }
    if (uVar11 == 0) {
      dVar22 = (double)lVar18;
      goto LAB_0016a279;
    }
  }
  else {
    while ((int)uVar19 < 0) {
      uVar9 = lVar14 * -0x3333333333333333 + 0x1999999999999998;
      if (0x1999999999999998 < (uVar9 >> 1 | (ulong)((uVar9 & 1) != 0) << 0x3f)) goto LAB_0016a1bc;
      lVar14 = lVar14 / 10;
LAB_0016a173:
      uVar11 = uVar12 - 1;
      bVar3 = (int)uVar12 < 2;
      uVar12 = uVar11;
      if (bVar3) goto LAB_0016a1a1;
    }
    if (lVar14 < 0xccccccccccccccc) {
      lVar14 = lVar14 * 10;
      goto LAB_0016a173;
    }
LAB_0016a1bc:
    lVar18 = -lVar14;
    if (bVar1 != 0x2d) {
      lVar18 = lVar14;
    }
    uVar11 = uVar12;
    if (0x133 < uVar12) {
      if (uVar12 < 0x156) {
        fVar5 = 10.0;
        if ((uVar12 & 1) == 0) {
          fVar5 = 1.0;
        }
        if (1 < uVar12 - 0x134) {
          fVar4 = 10.0;
          fVar6 = fVar5;
          uVar11 = uVar12 - 0x134;
          do {
            uVar12 = (int)uVar11 >> 1;
            fVar4 = fVar4 * fVar4;
            fVar5 = fVar6 * fVar4;
            if ((uVar11 & 2) == 0) {
              fVar5 = fVar6;
            }
            fVar6 = fVar5;
            uVar11 = uVar12;
          } while (1 < uVar12);
        }
        if ((int)uVar19 < 0) {
          dVar22 = (double)((float)lVar18 / fVar5) / 1e+308;
        }
        else {
          dVar22 = (double)((float)lVar18 * fVar5) * 1e+308;
        }
      }
      else if ((int)uVar19 < 0) {
        dVar22 = (double)((ulong)(double)lVar18 & 0x8000000000000000);
      }
      else {
        dVar22 = (double)((float)lVar18 * INFINITY);
      }
      goto LAB_0016a279;
    }
  }
  fVar5 = 10.0;
  if ((uVar11 & 1) == 0) {
    fVar5 = 1.0;
  }
  if (1 < uVar11) {
    fVar4 = 10.0;
    fVar6 = fVar5;
    do {
      uVar12 = (int)uVar11 >> 1;
      fVar4 = fVar4 * fVar4;
      fVar5 = fVar6 * fVar4;
      if ((uVar11 & 2) == 0) {
        fVar5 = fVar6;
      }
      fVar6 = fVar5;
      uVar11 = uVar12;
    } while (1 < uVar12);
  }
  if ((int)uVar19 < 0) {
    fVar5 = (float)lVar18 / fVar5;
  }
  else {
    fVar5 = (float)lVar18 * fVar5;
  }
  dVar22 = (double)fVar5;
  goto LAB_0016a279;
code_r0x0016a014:
  lVar14 = (long)(char)bVar2 + lVar14 * 10 + -0x30;
  pbVar10 = pbVar10 + lVar18;
  if (0xcccccccccccccca < lVar14) {
    for (; (pbVar10 < pbVar13 && (0xfffffffffffffff5 < (ulong)*pbVar10 - 0x3a));
        pbVar10 = pbVar10 + lVar18) {
      iVar8 = iVar8 + 1;
    }
  }
  iVar16 = iVar16 + 1;
  if (pbVar13 <= pbVar10) goto LAB_0016a0e1;
  goto LAB_0016a004;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd = z + length;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  i64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  double result;
  int nDigit = 0;  /* Number of digits processed */
  int eType = 1;   /* 1: pure integer,  2+: fractional  -1 or less: bad UTF16 */

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */

  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    int i;
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    testcase( enc==SQLITE_UTF16LE );
    testcase( enc==SQLITE_UTF16BE );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    if( i<length ) eType = -100;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) ){
    s = s*10 + (*z - '0');
    z+=incr; nDigit++;
    if( s>=((LARGEST_INT64-9)/10) ){
      /* skip non-significant significand digits
      ** (increase exponent by d to shift decimal left) */
      while( z<zEnd && sqlite3Isdigit(*z) ){ z+=incr; d++; }
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    eType++;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_INT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
        nDigit++;
      }
      z+=incr;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;
    eType++;

    /* This branch is needed to avoid a (harmless) buffer overread.  The 
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;
  if( e<0 ) {
    esign = -1;
    e *= -1;
  } else {
    esign = 1;
  }

  if( s==0 ) {
    /* In the IEEE 754 standard, zero is signed. */
    result = sign<0 ? -(double)0 : (double)0;
  } else {
    /* Attempt to reduce exponent.
    **
    ** Branches that are not required for the correct answer but which only
    ** help to obtain the correct answer faster are marked with special
    ** comments, as a hint to the mutation tester.
    */
    while( e>0 ){                                       /*OPTIMIZATION-IF-TRUE*/
      if( esign>0 ){
        if( s>=(LARGEST_INT64/10) ) break;             /*OPTIMIZATION-IF-FALSE*/
        s *= 10;
      }else{
        if( s%10!=0 ) break;                           /*OPTIMIZATION-IF-FALSE*/
        s /= 10;
      }
      e--;
    }

    /* adjust the sign of significand */
    s = sign<0 ? -s : s;

    if( e==0 ){                                         /*OPTIMIZATION-IF-TRUE*/
      result = (double)s;
    }else{
      /* attempt to handle extremely small/large numbers better */
      if( e>307 ){                                      /*OPTIMIZATION-IF-TRUE*/
        if( e<342 ){                                    /*OPTIMIZATION-IF-TRUE*/
          LONGDOUBLE_TYPE scale = sqlite3Pow10(e-308);
          if( esign<0 ){
            result = s / scale;
            result /= 1.0e+308;
          }else{
            result = s * scale;
            result *= 1.0e+308;
          }
        }else{ assert( e>=342 );
          if( esign<0 ){
            result = 0.0*s;
          }else{
#ifdef INFINITY
            result = INFINITY*s;
#else
            result = 1e308*1e308*s;  /* Infinity */
#endif
          }
        }
      }else{
        LONGDOUBLE_TYPE scale = sqlite3Pow10(e);
        if( esign<0 ){
          result = s / scale;
        }else{
          result = s * scale;
        }
      }
    }
  }

  /* store the result */
  *pResult = result;

  /* return true if number and no extra non-whitespace chracters after */
  if( z==zEnd && nDigit>0 && eValid && eType>0 ){
    return eType;
  }else if( eType>=2 && (eType==3 || eValid) && nDigit>0 ){
    return -1;
  }else{
    return 0;
  }
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}